

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall hdc::Driver::parseProgram(Driver *this)

{
  pointer pcVar1;
  SourceFile *file;
  string local_38;
  
  pcVar1 = (this->mainFilePath)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (this->mainFilePath)._M_string_length);
  file = parseFile(this,&local_38);
  parseImports(this,file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Driver::parseProgram() {
    /*Lex p;
    std::vector<Token> v = p.getTokens(mainFilePath);
    for (int i = 0; i < v.size(); ++i) {
        std::cout << v[i].toStr() << std::endl;
    }*/

    parseImports(parseFile(mainFilePath));
}